

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_float_ops_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::RelaxFloatOpsPass::IsFloat32(RelaxFloatOpsPass *this,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  DefUseManager *this_00;
  Instruction *this_01;
  Op local_1c;
  
  local_1c = inst->opcode_;
  sVar3 = std::
          _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->target_ops_core_f_opnd_)._M_h,&local_1c);
  if (sVar3 == 0) {
    uVar2 = Instruction::type_id(inst);
    if (uVar2 == 0) {
      return false;
    }
  }
  else {
    uVar2 = Instruction::GetSingleWordInOperand(inst,0);
    this_00 = Pass::get_def_use_mgr(&this->super_Pass);
    this_01 = analysis::DefUseManager::GetDef(this_00,uVar2);
    uVar2 = Instruction::type_id(this_01);
  }
  bVar1 = Pass::IsFloat(&this->super_Pass,uVar2,0x20);
  return bVar1;
}

Assistant:

bool RelaxFloatOpsPass::IsFloat32(Instruction* inst) {
  uint32_t ty_id;
  if (target_ops_core_f_opnd_.count(inst->opcode()) != 0) {
    uint32_t opnd_id = inst->GetSingleWordInOperand(0);
    Instruction* opnd_inst = get_def_use_mgr()->GetDef(opnd_id);
    ty_id = opnd_inst->type_id();
  } else {
    ty_id = inst->type_id();
    if (ty_id == 0) return false;
  }
  return IsFloat(ty_id, 32);
}